

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void icu_63::anon_unknown_15::appendCodePointDelta
               (uint8_t *cpStart,uint8_t *cpLimit,int32_t delta,ByteSink *sink,Edits *edits)

{
  int32_t iVar1;
  int oldLength;
  int iVar2;
  UChar32 UVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint32_t __uc;
  UChar32 c;
  int32_t trail;
  int32_t cpLength;
  int32_t length;
  char buffer [4];
  Edits *edits_local;
  ByteSink *sink_local;
  int32_t delta_local;
  uint8_t *cpLimit_local;
  uint8_t *cpStart_local;
  
  oldLength = (int)cpLimit - (int)cpStart;
  _length = edits;
  if (oldLength == 1) {
    trail = 1;
    cpLength._0_1_ = *cpStart + (char)delta;
  }
  else {
    iVar2 = (uint)cpLimit[-1] + delta;
    if ((iVar2 < 0x80) || (0xbf < iVar2)) {
      UVar3 = codePointFromValidUTF8(cpStart,cpLimit);
      uVar4 = UVar3 + delta;
      if (uVar4 < 0x80) {
        trail = 1;
        cpLength._0_1_ = (byte)uVar4;
      }
      else {
        if (uVar4 < 0x800) {
          cpLength._0_1_ = (byte)(uVar4 >> 6) | 0xc0;
          trail = 1;
        }
        else {
          if (uVar4 < 0x10000) {
            cpLength._0_1_ = (byte)(uVar4 >> 0xc) | 0xe0;
            trail = 1;
          }
          else {
            cpLength._0_1_ = (byte)(uVar4 >> 0x12) | 0xf0;
            cpLength._1_1_ = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
            trail = 2;
          }
          *(byte *)((long)&cpLength + (long)trail) = (byte)(uVar4 >> 6) & 0x3f | 0x80;
          trail = trail + 1;
        }
        *(byte *)((long)&cpLength + (long)trail) = (byte)uVar4 & 0x3f | 0x80;
        trail = trail + 1;
      }
    }
    else {
      trail = 0;
      iVar1 = trail;
      cpLimit_local = cpStart;
      do {
        trail = iVar1;
        puVar5 = cpLimit_local + 1;
        *(uint8_t *)((long)&cpLength + (long)trail) = *cpLimit_local;
        iVar1 = trail + 1;
        cpLimit_local = puVar5;
      } while (puVar5 < cpLimit + -1);
      *(char *)((long)&cpLength + (long)(trail + 1)) = (char)iVar2;
      trail = trail + 2;
    }
  }
  if (_length != (Edits *)0x0) {
    Edits::addReplace(_length,oldLength,trail);
  }
  (*sink->_vptr_ByteSink[2])(sink,&cpLength,(ulong)(uint)trail);
  return;
}

Assistant:

void
appendCodePointDelta(const uint8_t *cpStart, const uint8_t *cpLimit, int32_t delta,
                     ByteSink &sink, Edits *edits) {
    char buffer[U8_MAX_LENGTH];
    int32_t length;
    int32_t cpLength = (int32_t)(cpLimit - cpStart);
    if (cpLength == 1) {
        // The builder makes ASCII map to ASCII.
        buffer[0] = (uint8_t)(*cpStart + delta);
        length = 1;
    } else {
        int32_t trail = *(cpLimit-1) + delta;
        if (0x80 <= trail && trail <= 0xbf) {
            // The delta only changes the last trail byte.
            --cpLimit;
            length = 0;
            do { buffer[length++] = *cpStart++; } while (cpStart < cpLimit);
            buffer[length++] = (uint8_t)trail;
        } else {
            // Decode the code point, add the delta, re-encode.
            UChar32 c = codePointFromValidUTF8(cpStart, cpLimit) + delta;
            length = 0;
            U8_APPEND_UNSAFE(buffer, length, c);
        }
    }
    if (edits != nullptr) {
        edits->addReplace(cpLength, length);
    }
    sink.Append(buffer, length);
}